

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilNam.c
# Opt level: O0

void Abc_NamStrHashResize(Abc_Nam_t *p)

{
  int *__ptr;
  int iVar1;
  int iVar2;
  void *pvVar3;
  Vec_Int_t *p_00;
  char *pStr;
  int *piVar4;
  int local_40;
  int i;
  int iHandleOld;
  int *pBinsOld;
  int *piPlace;
  char *pThis;
  Vec_Int_t vInt2HandleOld;
  Abc_Nam_t *p_local;
  
  vInt2HandleOld.pArray = &p->nStore;
  if (p->pBins == (int *)0x0) {
    __assert_fail("p->pBins != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilNam.c"
                  ,0x14f,"void Abc_NamStrHashResize(Abc_Nam_t *)");
  }
  __ptr = p->pBins;
  iVar1 = Abc_PrimeCudd(p->nBins * 3);
  vInt2HandleOld.pArray[0xe] = iVar1;
  pvVar3 = calloc((long)vInt2HandleOld.pArray[0xe],4);
  *(void **)(vInt2HandleOld.pArray + 0xc) = pvVar3;
  pThis = *(char **)(vInt2HandleOld.pArray + 4);
  vInt2HandleOld.nCap = vInt2HandleOld.pArray[6];
  vInt2HandleOld.nSize = vInt2HandleOld.pArray[7];
  Vec_IntZero((Vec_Int_t *)(vInt2HandleOld.pArray + 4));
  p_00 = (Vec_Int_t *)(vInt2HandleOld.pArray + 4);
  iVar1 = Vec_IntSize((Vec_Int_t *)&pThis);
  Vec_IntGrow(p_00,iVar1 << 1);
  Vec_IntPush((Vec_Int_t *)(vInt2HandleOld.pArray + 4),-1);
  Vec_IntClear((Vec_Int_t *)(vInt2HandleOld.pArray + 8));
  Vec_IntPush((Vec_Int_t *)(vInt2HandleOld.pArray + 8),-1);
  local_40 = 1;
  while( true ) {
    iVar1 = Vec_IntSize((Vec_Int_t *)&pThis);
    if (iVar1 <= local_40) {
      Vec_IntErase((Vec_Int_t *)&pThis);
      if (__ptr != (int *)0x0) {
        free(__ptr);
      }
      return;
    }
    iVar1 = Vec_IntEntry((Vec_Int_t *)&pThis,local_40);
    pStr = Abc_NamHandleToStr((Abc_Nam_t *)vInt2HandleOld.pArray,iVar1);
    piVar4 = Abc_NamStrHashFind((Abc_Nam_t *)vInt2HandleOld.pArray,pStr,(char *)0x0);
    if (*piVar4 != 0) break;
    iVar2 = Vec_IntSize((Vec_Int_t *)(vInt2HandleOld.pArray + 4));
    *piVar4 = iVar2;
    iVar2 = Vec_IntSize((Vec_Int_t *)(vInt2HandleOld.pArray + 4));
    if (iVar2 != local_40) {
      __assert_fail("Vec_IntSize( &p->vInt2Handle ) == i",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilNam.c"
                    ,0x162,"void Abc_NamStrHashResize(Abc_Nam_t *)");
    }
    Vec_IntPush((Vec_Int_t *)(vInt2HandleOld.pArray + 4),iVar1);
    Vec_IntPush((Vec_Int_t *)(vInt2HandleOld.pArray + 8),0);
    local_40 = local_40 + 1;
  }
  __assert_fail("*piPlace == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/utilNam.c"
                ,0x160,"void Abc_NamStrHashResize(Abc_Nam_t *)");
}

Assistant:

void Abc_NamStrHashResize( Abc_Nam_t * p )
{
    Vec_Int_t vInt2HandleOld;  char * pThis; 
    int * piPlace, * pBinsOld, iHandleOld, i;//, clk = Abc_Clock();
    assert( p->pBins != NULL );
//    Abc_Print( 1, "Resizing names manager hash table from %6d to %6d. ", p->nBins, Abc_PrimeCudd( 3 * p->nBins ) );
    // replace the table
    pBinsOld = p->pBins;
    p->nBins = Abc_PrimeCudd( 3 * p->nBins ); 
    p->pBins = ABC_CALLOC( int, p->nBins );
    // replace the handles array
    vInt2HandleOld = p->vInt2Handle;
    Vec_IntZero( &p->vInt2Handle );
    Vec_IntGrow( &p->vInt2Handle, 2 * Vec_IntSize(&vInt2HandleOld) ); 
    Vec_IntPush( &p->vInt2Handle, -1 );
    Vec_IntClear( &p->vInt2Next );    Vec_IntPush( &p->vInt2Next, -1 );
    // rehash the entries from the old table
    Vec_IntForEachEntryStart( &vInt2HandleOld, iHandleOld, i, 1 )
    {
        pThis   = Abc_NamHandleToStr( p, iHandleOld );
        piPlace = Abc_NamStrHashFind( p, pThis, NULL );
        assert( *piPlace == 0 );
        *piPlace = Vec_IntSize( &p->vInt2Handle );
        assert( Vec_IntSize( &p->vInt2Handle ) == i );
        Vec_IntPush( &p->vInt2Handle, iHandleOld );
        Vec_IntPush( &p->vInt2Next,   0 );
    }
    Vec_IntErase( &vInt2HandleOld );
    ABC_FREE( pBinsOld );
//    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}